

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_music.cpp
# Opt level: O1

void Cmd_writewave(FCommandLine *argv,APlayerPawn *who,int key)

{
  MusInfo *pMVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  char *__nptr;
  long *plVar5;
  ulong uVar6;
  undefined4 extraout_var;
  
  iVar2 = FCommandLine::argc(argv);
  if (1 < iVar2) {
    iVar2 = FCommandLine::argc(argv);
    pMVar1 = currSong;
    if (iVar2 < 4) {
      if (currSong == (MusInfo *)0x0) {
        pcVar4 = "No song is currently playing.\n";
      }
      else {
        pcVar4 = FCommandLine::operator[](argv,1);
        iVar2 = FCommandLine::argc(argv);
        uVar6 = 0;
        if (iVar2 == 3) {
          __nptr = FCommandLine::operator[](argv,2);
          uVar3 = atoi(__nptr);
          uVar6 = (ulong)uVar3;
        }
        iVar2 = (*pMVar1->_vptr_MusInfo[0x10])(pMVar1,pcVar4,uVar6);
        plVar5 = (long *)CONCAT44(extraout_var,iVar2);
        if (plVar5 != (long *)0x0) {
          (**(code **)(*plVar5 + 0x20))(plVar5,0,0);
          (**(code **)(*plVar5 + 8))(plVar5);
          return;
        }
        pcVar4 = "Current song cannot be saved as wave data.\n";
      }
      goto LAB_00335141;
    }
  }
  pcVar4 = "Usage: writewave <filename> [sample rate]";
LAB_00335141:
  Printf(pcVar4);
  return;
}

Assistant:

CCMD (writewave)
{
	if (argv.argc() >= 2 && argv.argc() <= 3)
	{
		if (currSong == NULL)
		{
			Printf ("No song is currently playing.\n");
		}
		else
		{
			MusInfo *dumper = currSong->GetWaveDumper(argv[1], argv.argc() == 3 ? atoi(argv[2]) : 0);
			if (dumper == NULL)
			{
				Printf ("Current song cannot be saved as wave data.\n");
			}
			else
			{
				dumper->Play(false, 0);		// FIXME: Remember subsong
				delete dumper;
			}
		}
	}
	else
	{
		Printf ("Usage: writewave <filename> [sample rate]");
	}
}